

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim.c
# Opt level: O2

int Pdr_ManExtendOne(Aig_Man_t *pAig,Aig_Obj_t *pObj,Vec_Int_t *vUndo,Vec_Int_t *vVis)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pObj_00;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  
  iVar2 = Saig_ObjIsLo(pAig,pObj);
  if (iVar2 == 0) {
    __assert_fail("Saig_ObjIsLo(pAig, pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrTsim.c"
                  ,0xcb,"int Pdr_ManExtendOne(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (pObj->TravId != pAig->nTravIds) {
    __assert_fail("Aig_ObjIsTravIdCurrent(pAig, pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrTsim.c"
                  ,0xcc,"int Pdr_ManExtendOne(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  iVar2 = Pdr_ManSimInfoGet(pAig,pObj);
  if (1 < iVar2 - 1U) {
    __assert_fail("Value == PDR_ZER || Value == PDR_ONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrTsim.c"
                  ,0xcf,"int Pdr_ManExtendOne(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  Vec_IntPush(vUndo,pObj->Id);
  Vec_IntPush(vUndo,iVar2);
  Pdr_ManSimInfoSet(pAig,pObj,3);
  vVis->nSize = 0;
  Vec_IntPush(vVis,pObj->Id);
  uVar10 = 0xffffffff;
  iVar2 = 0;
  do {
    if (vVis->nSize <= iVar2) {
      return 1;
    }
    iVar3 = Vec_IntEntry(vVis,iVar2);
    pAVar6 = Aig_ManObj(pAig,iVar3);
    if (pAig->pFanData == (int *)0x0) {
      __assert_fail("pAig->pFanData",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrTsim.c"
                    ,0xd9,"int Pdr_ManExtendOne(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    for (uVar9 = 0; uVar9 < *(uint *)&pAVar6->field_0x18 >> 6; uVar9 = uVar9 + 1) {
      if (uVar9 == 0) {
        if (pAig->nFansAlloc <= pAVar6->Id) {
          __assert_fail("ObjId < p->nFansAlloc",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                        ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
        }
        iVar3 = pAVar6->Id * 5;
      }
      else {
        if (pAig->nFansAlloc <= (int)uVar10 / 2) {
          __assert_fail("iFan/2 < p->nFansAlloc",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                        ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
        }
        iVar3 = ((int)uVar10 >> 1) * 5 + (uVar10 & 1) + 3;
      }
      uVar10 = pAig->pFanData[iVar3];
      pObj_00 = Aig_ManObj(pAig,(int)uVar10 >> 1);
      if (pObj_00->TravId == pAig->nTravIds) {
        if (pObj_00->Id <= pAVar6->Id) {
          __assert_fail("Aig_ObjId(pObj) < Aig_ObjId(pFanout)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrTsim.c"
                        ,0xdd,
                        "int Pdr_ManExtendOne(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        iVar3 = Pdr_ManSimInfoGet(pAig,pObj_00);
        if ((iVar3 != 3) && (iVar4 = Pdr_ManExtendOneEval(pAig,pObj_00), iVar4 != iVar3)) {
          if (iVar4 != 3) {
            __assert_fail("Value2 == PDR_UND",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrTsim.c"
                          ,0xe4,
                          "int Pdr_ManExtendOne(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          Vec_IntPush(vUndo,pObj_00->Id);
          Vec_IntPush(vUndo,iVar3);
          uVar7 = (uint)*(undefined8 *)&pObj_00->field_0x18;
          if ((uVar7 & 7) == 3) {
            return 0;
          }
          if ((uVar7 & 7) - 7 < 0xfffffffe) {
            __assert_fail("Aig_ObjIsNode(pFanout)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrTsim.c"
                          ,0xe9,
                          "int Pdr_ManExtendOne(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          iVar3 = pObj_00->Id;
          uVar7 = vVis->nSize;
          if (uVar7 == vVis->nCap) {
            iVar4 = uVar7 * 2;
            if ((int)uVar7 < 0x10) {
              iVar4 = 0x10;
            }
            Vec_IntGrow(vVis,iVar4);
            uVar7 = vVis->nSize;
          }
          vVis->nSize = uVar7 + 1;
          piVar1 = vVis->pArray;
          for (uVar8 = (ulong)uVar7;
              (uVar5 = (int)uVar7 >> 0x1f & uVar7, 0 < (int)(uint)uVar8 &&
              (uVar5 = (uint)uVar8, iVar3 < piVar1[uVar8 - 1])); uVar8 = uVar8 - 1) {
            piVar1[uVar8] = piVar1[uVar8 - 1];
          }
          piVar1[(int)uVar5] = iVar3;
        }
      }
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

int Pdr_ManExtendOne( Aig_Man_t * pAig, Aig_Obj_t * pObj, Vec_Int_t * vUndo, Vec_Int_t * vVis )
{
    Aig_Obj_t * pFanout;
    int i, k, iFanout = -1, Value, Value2;
    assert( Saig_ObjIsLo(pAig, pObj) );
    assert( Aig_ObjIsTravIdCurrent(pAig, pObj) );
    // save original value
    Value = Pdr_ManSimInfoGet( pAig, pObj );
    assert( Value == PDR_ZER || Value == PDR_ONE );
    Vec_IntPush( vUndo, Aig_ObjId(pObj) );
    Vec_IntPush( vUndo, Value );
    // update original value
    Pdr_ManSimInfoSet( pAig, pObj, PDR_UND );
    // traverse
    Vec_IntClear( vVis );
    Vec_IntPush( vVis, Aig_ObjId(pObj) );
    Aig_ManForEachObjVec( vVis, pAig, pObj, i )
    {
        Aig_ObjForEachFanout( pAig, pObj, pFanout, iFanout, k )
        {
            if ( !Aig_ObjIsTravIdCurrent(pAig, pFanout) )
                continue;
            assert( Aig_ObjId(pObj) < Aig_ObjId(pFanout) );
            Value = Pdr_ManSimInfoGet( pAig, pFanout );
            if ( Value == PDR_UND )
                continue;
            Value2 = Pdr_ManExtendOneEval( pAig, pFanout );
            if ( Value2 == Value )
                continue;
            assert( Value2 == PDR_UND );
            Vec_IntPush( vUndo, Aig_ObjId(pFanout) );
            Vec_IntPush( vUndo, Value );
            if ( Aig_ObjIsCo(pFanout) )
                return 0;
            assert( Aig_ObjIsNode(pFanout) );
            Vec_IntPushOrder( vVis, Aig_ObjId(pFanout) );
        }
    }
    return 1;
}